

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shake256_impl.c
# Opt level: O3

int shake256_init(keccak_sponge *sponge)

{
  int iVar1;
  
  if (sponge == (keccak_sponge *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = 0;
    memset(sponge,0,200);
    sponge->position = 0;
    sponge->flags = 0x53efb6b64647b401;
  }
  return iVar1;
}

Assistant:

int shake256_init(keccak_sponge* const __restrict sponge) {
  if (sponge == NULL) {
    return SPONGERR_NULL;
  };
  memset(sponge->a, 0, 200);
  sponge->position = 0;
  sponge->flags = FLAG_ABSORBING;
  return 0;
}